

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_frame_codec.c
# Opt level: O1

int amqp_frame_codec_encode_empty_frame
              (AMQP_FRAME_CODEC_HANDLE amqp_frame_codec,uint16_t channel,
              ON_BYTES_ENCODED on_bytes_encoded,void *callback_context)

{
  int iVar1;
  LOGGER_LOG p_Var2;
  int iVar3;
  char *pcVar4;
  uchar channel_bytes [2];
  
  if (amqp_frame_codec == (AMQP_FRAME_CODEC_HANDLE)0x0) {
    p_Var2 = xlogging_get_log_function();
    iVar1 = 0x15c;
    if (p_Var2 == (LOGGER_LOG)0x0) {
      return 0x15c;
    }
    pcVar4 = "NULL amqp_frame_codec";
    iVar3 = 0x15b;
  }
  else {
    channel_bytes = (uchar  [2])(channel << 8 | channel >> 8);
    iVar1 = frame_codec_encode_frame
                      (amqp_frame_codec->frame_codec,'\0',(PAYLOAD *)0x0,0,channel_bytes,2,
                       on_bytes_encoded,callback_context);
    if (iVar1 == 0) {
      return 0;
    }
    p_Var2 = xlogging_get_log_function();
    iVar1 = 0x16a;
    if (p_Var2 == (LOGGER_LOG)0x0) {
      return 0x16a;
    }
    pcVar4 = "frame_codec_encode_frame failed when encoding empty frame";
    iVar3 = 0x169;
  }
  (*p_Var2)(AZ_LOG_ERROR,
            "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/amqp_frame_codec.c"
            ,"amqp_frame_codec_encode_empty_frame",iVar3,1,pcVar4);
  return iVar1;
}

Assistant:

int amqp_frame_codec_encode_empty_frame(AMQP_FRAME_CODEC_HANDLE amqp_frame_codec, uint16_t channel, ON_BYTES_ENCODED on_bytes_encoded, void* callback_context)
{
    int result;

    /* Codes_SRS_AMQP_FRAME_CODEC_01_045: [If amqp_frame_codec is NULL, amqp_frame_codec_encode_empty_frame shall fail and return a non-zero value.] */
    if (amqp_frame_codec == NULL)
    {
        LogError("NULL amqp_frame_codec");
        result = MU_FAILURE;
    }
    else
    {
        unsigned char channel_bytes[2];

        channel_bytes[0] = channel >> 8;
        channel_bytes[1] = channel & 0xFF;

        /* Codes_SRS_AMQP_FRAME_CODEC_01_044: [amqp_frame_codec_encode_empty_frame shall use frame_codec_encode_frame to encode the frame.] */
        if (frame_codec_encode_frame(amqp_frame_codec->frame_codec, FRAME_TYPE_AMQP, NULL, 0, channel_bytes, sizeof(channel_bytes), on_bytes_encoded, callback_context) != 0)
        {
            /* Codes_SRS_AMQP_FRAME_CODEC_01_046: [If encoding fails in any way, amqp_frame_codec_encode_empty_frame shall fail and return a non-zero value.]  */
            LogError("frame_codec_encode_frame failed when encoding empty frame");
            result = MU_FAILURE;
        }
        else
        {
            /* Codes_SRS_AMQP_FRAME_CODEC_01_043: [On success, amqp_frame_codec_encode_empty_frame shall return 0.] */
            result = 0;
        }
    }

    return result;
}